

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Statement * inputStatement(void)

{
  TokenType TVar1;
  Token t;
  Token t_00;
  void *__ptr;
  Statement *pSVar2;
  int iVar3;
  undefined4 uVar4;
  TokenList *pTVar5;
  undefined4 *in_RDI;
  char *unaff_R12;
  size_t __size;
  char *unaff_R15;
  Token h_1;
  Token h;
  undefined4 in_stack_ffffffffffffff58;
  uint uVar6;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 uStack_80;
  undefined8 uStack_60;
  Token local_50;
  
  *in_RDI = 2;
  pTVar5 = head;
  uVar6 = (head->value).line;
  in_RDI[2] = uVar6;
  in_RDI[3] = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  iVar3 = 1;
  __size = 0x18;
  __ptr = (void *)0x0;
  do {
    __ptr = realloc(__ptr,__size);
    TVar1 = (pTVar5->value).type;
    if (TVar1 == TOKEN_IDENTIFIER) {
      if (pTVar5->next == (TokenList *)0x0) {
        uStack_80._0_4_ = -1;
        uStack_80._4_4_ = 0;
        in_stack_ffffffffffffff68._0_4_ = TOKEN_ERROR;
        in_stack_ffffffffffffff68._4_4_ = 0;
      }
      else {
        in_stack_ffffffffffffff68._0_4_ = (pTVar5->value).type;
        in_stack_ffffffffffffff68._4_4_ = *(undefined4 *)&(pTVar5->value).field_0x4;
        uStack_80._0_4_ = (pTVar5->value).length;
        uStack_80._4_4_ = (pTVar5->value).line;
        head = pTVar5->next;
      }
      t_00.start._0_4_ = in_stack_ffffffffffffff58;
      t_00.type = (int)uStack_80;
      t_00._4_4_ = uStack_80._4_4_;
      t_00.start._4_4_ = uVar6;
      t_00.file = (char *)in_RDI;
      t_00.length = (TokenType)in_stack_ffffffffffffff68;
      t_00.line = SUB84(in_stack_ffffffffffffff68,4);
      unaff_R15 = stringOf(t_00);
      unaff_R12 = (char *)((ulong)unaff_R12 & 0xffffffff00000000);
      uVar4 = 1;
      if ((head != (TokenList *)0x0) && ((head->value).type == TOKEN_COLON)) {
        pTVar5 = head->next;
        if (pTVar5 == (TokenList *)0x0) {
LAB_001046cc:
          printf("\x1b[31m\n[Error] [Line:%d] Bad input format specifier!\x1b[0m",(ulong)uVar6);
          he = he + 1;
        }
        else {
          TVar1 = (pTVar5->value).type;
          head = pTVar5;
          if (TVar1 == TOKEN_FLOAT) {
            if (pTVar5->next != (TokenList *)0x0) {
              head = pTVar5->next;
            }
            unaff_R12 = (char *)((ulong)unaff_R12 | 2);
          }
          else {
            if (TVar1 != TOKEN_INT) goto LAB_001046cc;
            if (pTVar5->next != (TokenList *)0x0) {
              head = pTVar5->next;
            }
            unaff_R12 = (char *)((ulong)unaff_R12 | 1);
          }
        }
      }
LAB_001046fa:
      *(undefined4 *)((long)__ptr + (__size - 0x18)) = uVar4;
      *(char **)((long)__ptr + (__size - 0x10)) = unaff_R12;
      *(char **)((long)__ptr + (__size - 8)) = unaff_R15;
    }
    else {
      if (TVar1 == TOKEN_STRING) {
        if (pTVar5->next == (TokenList *)0x0) {
          uStack_60._0_4_ = -1;
          uStack_60._4_4_ = 0;
        }
        else {
          uStack_60._0_4_ = (pTVar5->value).length;
          uStack_60._4_4_ = (pTVar5->value).line;
          head = pTVar5->next;
        }
        uVar4 = 0;
        t.start._0_4_ = in_stack_ffffffffffffff58;
        t.type = (int)uStack_60;
        t._4_4_ = uStack_60._4_4_;
        t.start._4_4_ = uVar6;
        t.file = (char *)in_RDI;
        t.length = (TokenType)in_stack_ffffffffffffff68;
        t.line = SUB84(in_stack_ffffffffffffff68,4);
        unaff_R12 = stringOf(t);
        goto LAB_001046fa;
      }
      printf("\x1b[31m\n[Error] [Line:%d] Bad input statement!\x1b[0m",(ulong)uVar6);
      he = he + 1;
    }
    if ((head == (TokenList *)0x0) || ((head->value).type != TOKEN_COMMA)) {
      in_RDI[3] = iVar3;
      *(void **)(in_RDI + 4) = __ptr;
      pSVar2 = (Statement *)consume(&local_50,TOKEN_NEWLINE,"Expected newline after Input!");
      return pSVar2;
    }
    if (head->next != (TokenList *)0x0) {
      head = head->next;
    }
    iVar3 = iVar3 + 1;
    __size = __size + 0x18;
    pTVar5 = head;
  } while( true );
}

Assistant:

static Statement inputStatement(){
    Statement s;
    s.type = STATEMENT_INPUT;
    debug("Parsing input statement");
    s.inputStatement.line = presentLine();
    s.inputStatement.count = 0;
    s.inputStatement.inputs = 0;
    do{
        s.inputStatement.count++;
        s.inputStatement.inputs = (Input *)reallocate(s.inputStatement.inputs, sizeof(Input) * s.inputStatement.count);
        Input i;
        if(peek() == TOKEN_STRING){
            i.type = INPUT_PROMPT;
            i.prompt = stringOf(advance());
        }
        else if(peek() == TOKEN_IDENTIFIER){
            i.type = INPUT_IDENTIFER;
            i.identifer = stringOf(advance());
            i.datatype = INPUT_ANY;
            if(match(TOKEN_COLON)){
                if(match(TOKEN_INT))
                    i.datatype = INPUT_INT;
                else if(match(TOKEN_FLOAT))
                    i.datatype = INPUT_FLOAT;
                else{
                    printf(line_error("Bad input format specifier!"), s.inputStatement.line);
                    he++;
                }
            }
        }
        else{
            printf(line_error("Bad input statement!"), s.inputStatement.line);
            he++;
            continue;
        }
        s.inputStatement.inputs[s.inputStatement.count - 1] = i;
    } while(match(TOKEN_COMMA));

    consume(TOKEN_NEWLINE, "Expected newline after Input!");
    return s;
}